

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void __thiscall f8n::debug::ConsoleBackend::verbose(ConsoleBackend *this,string *tag,string *string)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"verbose","");
  writeTo((ostream *)&std::cout,&local_40,tag,string);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void debug::ConsoleBackend::verbose(const std::string& tag, const std::string& string) {
        writeTo(std::cout, "verbose", tag, string);
    }